

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O3

void composition_solid_source_over(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (const_alpha != 0xff) {
    uVar1 = (color & 0xff00ff) * const_alpha;
    uVar2 = (color >> 8 & 0xff00ff) * const_alpha;
    color = uVar2 + 0x800080 + (uVar2 >> 8 & 0xff00ff) & 0xff00ff00 |
            uVar1 + 0x800080 + (uVar1 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
  }
  if (0 < length) {
    uVar3 = 0;
    do {
      uVar1 = (dest[uVar3] & 0xff00ff) * (~color >> 0x18);
      uVar2 = (dest[uVar3] >> 8 & 0xff00ff) * (~color >> 0x18);
      dest[uVar3] = (uVar1 + 0x800080 + (uVar1 >> 8 & 0xff00ff) >> 8 & 0xff00ff) + color +
                    (uVar2 + 0x800080 + (uVar2 >> 8 & 0xff00ff) & 0xff00ff00);
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
  }
  return;
}

Assistant:

static void composition_solid_source_over(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha != 255)
        color = BYTE_MUL(color, const_alpha);
    uint32_t ialpha = 255 - plutovg_alpha(color);
    for(int i = 0; i < length; i++) {
        dest[i] = color + BYTE_MUL(dest[i], ialpha);
    }
}